

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::hufBuildDecTable(longlong *hcode,int im,int iM,HufDec *hdecod)

{
  char cVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  HufDec *pHVar12;
  long lVar13;
  int *p;
  bool bVar14;
  
  bVar2 = iM < im;
  if (im <= iM) {
    lVar11 = hcode[im] >> 6;
    uVar7 = (uint)hcode[im] & 0x3f;
    if (lVar11 >> (sbyte)uVar7 == 0) {
      lVar13 = (long)im;
      do {
        if (uVar7 < 0xf) {
          if (uVar7 != 0) {
            bVar8 = 1;
            bVar14 = 0xe - uVar7 == 0x3f;
            if (!bVar14) {
              bVar5 = (byte)(0xe - uVar7);
              lVar11 = lVar11 << (bVar5 & 0x3f);
              if (*(char *)(hdecod + lVar11) == '\0') {
                pHVar12 = hdecod + lVar11 + 1;
                lVar11 = (1L << (bVar5 & 0x3f)) + 1;
                do {
                  if (pHVar12[-1].p != (int *)0x0) break;
                  *(uint *)(pHVar12 + -1) = (int)lVar13 << 8 | uVar7;
                  lVar10 = lVar11 + -1;
                  bVar14 = lVar10 < 2;
                  if (SBORROW8(lVar10,2) != lVar11 + -3 < 0) goto LAB_00125d41;
                  cVar1 = *(char *)pHVar12;
                  pHVar12 = pHVar12 + 1;
                  lVar11 = lVar10;
                } while (cVar1 == '\0');
              }
              bVar8 = 0;
            }
LAB_00125d41:
            if (!(bool)(bVar14 | bVar8)) {
              return bVar2;
            }
          }
        }
        else {
          lVar11 = lVar11 >> ((char)uVar7 - 0xeU & 0x3f);
          if ((char)*(int *)(hdecod + lVar11) != '\0') {
            return bVar2;
          }
          pHVar12 = hdecod + lVar11;
          iVar6 = *(int *)(hdecod + lVar11) + 0x100;
          *(int *)pHVar12 = iVar6;
          piVar4 = pHVar12->p;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)operator_new__(4);
            pHVar12->p = piVar4;
          }
          else {
            iVar6 = iVar6 >> 8;
            uVar9 = (long)iVar6 * 4;
            if (iVar6 < 0) {
              uVar9 = 0xffffffffffffffff;
            }
            piVar3 = (int *)operator_new__(uVar9);
            pHVar12->p = piVar3;
            iVar6 = *(int *)pHVar12;
            if (1 < iVar6 >> 8) {
              uVar9 = 0;
              do {
                piVar3[uVar9] = piVar4[uVar9];
                uVar9 = uVar9 + 1;
              } while ((iVar6 >> 8) - 1 != uVar9);
            }
            operator_delete__(piVar4);
          }
          pHVar12->p[(long)(*(int *)pHVar12 >> 8) + -1] = (int)lVar13;
        }
        lVar10 = lVar13 + 1;
        bVar2 = iM <= lVar13;
        if (iM + 1 == (int)lVar10) {
          return bVar2;
        }
        lVar11 = hcode[lVar10] >> 6;
        uVar7 = (uint)hcode[lVar10] & 0x3f;
        lVar13 = lVar10;
      } while (lVar11 >> (sbyte)uVar7 == 0);
    }
  }
  return bVar2;
}

Assistant:

bool hufBuildDecTable(const long long *hcode,  // i : encoding table
                      int im,                  // i : min index in hcode
                      int iM,                  // i : max index in hcode
                      HufDec *hdecod)          //  o: (allocated by caller)
//     decoding table [HUF_DECSIZE]
{
  //
  // Init hashtable & loop on all codes.
  // Assumes that hufClearDecTable(hdecod) has already been called.
  //

  for (; im <= iM; im++) {
    long long c = hufCode(hcode[im]);
    int l = hufLength(hcode[im]);

    if (c >> l) {
      //
      // Error: c is supposed to be an l-bit code,
      // but c contains a value that is greater
      // than the largest l-bit number.
      //

      // invalidTableEntry();
      return false;
    }

    if (l > HUF_DECBITS) {
      //
      // Long code: add a secondary entry
      //

      HufDec *pl = hdecod + (c >> (l - HUF_DECBITS));

      if (pl->len) {
        //
        // Error: a short code has already
        // been stored in table entry *pl.
        //

        // invalidTableEntry();
        return false;
      }

      pl->lit++;

      if (pl->p) {
        int *p = pl->p;
        pl->p = new int[pl->lit];

        for (int i = 0; i < pl->lit - 1; ++i) pl->p[i] = p[i];

        delete[] p;
      } else {
        pl->p = new int[1];
      }

      pl->p[pl->lit - 1] = im;
    } else if (l) {
      //
      // Short code: init all primary entries
      //

      HufDec *pl = hdecod + (c << (HUF_DECBITS - l));

      for (long long i = 1ULL << (HUF_DECBITS - l); i > 0; i--, pl++) {
        if (pl->len || pl->p) {
          //
          // Error: a short code or a long code has
          // already been stored in table entry *pl.
          //

          // invalidTableEntry();
          return false;
        }

        pl->len = l;
        pl->lit = im;
      }
    }
  }

  return true;
}